

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib582.c
# Opt level: O2

void addFd(Sockets *sockets,curl_socket_t fd,char *what)

{
  curl_socket_t *__ptr;
  curl_socket_t *pcVar1;
  
  curl_mfprintf(_stderr,"Add socket fd %d for %s\n",fd,what);
  removeFd(sockets,fd,0);
  __ptr = sockets->sockets;
  if (__ptr == (curl_socket_t *)0x0) {
    pcVar1 = (curl_socket_t *)malloc(0x50);
    sockets->sockets = pcVar1;
    if (pcVar1 == (curl_socket_t *)0x0) {
      return;
    }
    sockets->max_count = 0x14;
  }
  else {
    pcVar1 = __ptr;
    if (sockets->max_count <= sockets->count) {
      pcVar1 = (curl_socket_t *)realloc(__ptr,(long)sockets->max_count * 4 + 0x50);
      sockets->sockets = pcVar1;
      if (pcVar1 == (curl_socket_t *)0x0) {
        sockets->sockets = __ptr;
        return;
      }
      sockets->max_count = sockets->max_count + 0x14;
    }
  }
  pcVar1[sockets->count] = fd;
  sockets->count = sockets->count + 1;
  return;
}

Assistant:

static void addFd(struct Sockets* sockets, curl_socket_t fd, const char *what)
{
  /**
   * To ensure we only have each file descriptor once, we remove it then add
   * it again.
   */
  fprintf(stderr, "Add socket fd %d for %s\n", (int) fd, what);
  removeFd(sockets, fd, 0);
  /*
   * Allocate array storage when required.
   */
  if(!sockets->sockets) {
    sockets->sockets = malloc(sizeof(curl_socket_t) * 20U);
    if(!sockets->sockets)
      return;
    sockets->max_count = 20;
  }
  else if(sockets->count + 1 > sockets->max_count) {
    curl_socket_t *oldptr = sockets->sockets;
    sockets->sockets = realloc(oldptr, sizeof(curl_socket_t) *
                               (sockets->max_count + 20));
    if(!sockets->sockets) {
      /* cleanup in test_cleanup */
      sockets->sockets = oldptr;
      return;
    }
    sockets->max_count += 20;
  }
  /*
   * Add file descriptor to array.
   */
  sockets->sockets[sockets->count] = fd;
  ++sockets->count;
}